

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_private.h
# Opt level: O3

char * ERR_getErrorName(size_t code)

{
  uint uVar1;
  
  uVar1 = 0;
  if (0xfffffffffffffff7 < code) {
    uVar1 = -(int)code;
  }
  if (uVar1 < 9) {
    return &DAT_0019d718 + *(int *)(&DAT_0019d718 + (ulong)uVar1 * 4);
  }
  return "Unspecified error code";
}

Assistant:

ERR_STATIC ERR_enum ERR_getErrorCode(size_t code) { if (!ERR_isError(code)) return (ERR_enum)0; return (ERR_enum) (0-code); }